

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

double gflags::DoubleFromEnv(char *v,double dflt)

{
  double dVar1;
  double dflt_local;
  char *v_local;
  
  dVar1 = anon_unknown_2::GetFromEnv<double>(v,dflt);
  return dVar1;
}

Assistant:

double DoubleFromEnv(const char *v, double dflt) {
  return GetFromEnv(v, dflt);
}